

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_CreateMonitoredItems
               (UA_Server *server,UA_Session *session,UA_CreateMonitoredItemsRequest *request,
               UA_CreateMonitoredItemsResponse *response)

{
  size_t __nmemb;
  UA_MonitoredItemCreateRequest *pUVar1;
  long lVar2;
  long *plVar3;
  UA_MonitoredItem *pUVar4;
  UA_StatusCode UVar5;
  UA_UInt32 UVar6;
  UA_MonitoredItemCreateResult *pUVar7;
  UA_Session *pUVar8;
  long lVar9;
  UA_Session *session_00;
  long lVar10;
  ulong uVar11;
  UA_Subscription *pUVar12;
  UA_DataValue local_d8;
  UA_ReadValueId *local_70;
  UA_CreateMonitoredItemsResponse *local_68;
  UA_CreateMonitoredItemsRequest *local_60;
  UA_ListOfUAMonitoredItems *local_58;
  UA_TimestampsToReturn local_4c;
  UA_Server *local_48;
  UA_Session *local_40;
  UA_MonitoredItemCreateResult *local_38;
  
  UVar5 = 0x802b0000;
  if (request->timestampsToReturn < 4) {
    pUVar12 = (UA_Subscription *)&session->serverSubscriptions;
    UVar5 = 0x80280000;
    do {
      pUVar12 = (pUVar12->listEntry).le_next;
      if (pUVar12 == (UA_Subscription *)0x0) goto LAB_001255bd;
    } while (pUVar12->subscriptionID != request->subscriptionId);
    if (pUVar12 != (UA_Subscription *)0x0) {
      pUVar12->currentLifetimeCount = 0;
      __nmemb = request->itemsToCreateSize;
      if (__nmemb == 0) {
        UVar5 = 0x800f0000;
      }
      else {
        session_00 = (UA_Session *)0x48;
        local_48 = server;
        pUVar7 = (UA_MonitoredItemCreateResult *)calloc(__nmemb,0x48);
        response->results = pUVar7;
        if (pUVar7 != (UA_MonitoredItemCreateResult *)0x0) {
          response->resultsSize = __nmemb;
          if (request->itemsToCreateSize == 0) {
            return;
          }
          local_58 = &pUVar12->monitoredItems;
          lVar9 = 0x50;
          lVar10 = 0;
          uVar11 = 0;
          local_68 = response;
          local_60 = request;
          do {
            local_4c = local_60->timestampsToReturn;
            pUVar1 = local_60->itemsToCreate;
            local_70 = (UA_ReadValueId *)((long)pUVar1 + lVar9 + -0x50);
            local_38 = local_68->results;
            local_d8.serverTimestamp = 0;
            local_d8.serverPicoseconds = 0;
            local_d8._90_6_ = 0;
            local_d8.sourceTimestamp = 0;
            local_d8.sourcePicoseconds = 0;
            local_d8._74_6_ = 0;
            local_d8.value.arrayDimensions = (UA_UInt32 *)0x0;
            local_d8.status = 0;
            local_d8._60_4_ = 0;
            local_d8.value.data = (void *)0x0;
            local_d8.value.arrayDimensionsSize = 0;
            local_d8.value.storageType = UA_VARIANT_DATA;
            local_d8.value._12_4_ = 0;
            local_d8.value.arrayLength = 0;
            local_d8._0_8_ = 0;
            local_d8.value.type = (UA_DataType *)0x0;
            Service_Read_single(local_48,session_00,local_4c,local_70,&local_d8);
            if (((((local_d8._0_8_ & 2) == 0) || (-1 < (int)local_d8.status)) ||
                (local_d8.status == 0x80040000)) ||
               ((local_d8.status == 0x80050000 || (local_d8.status == 0x80320000)))) {
              session_00 = (UA_Session *)(UA_TYPES + 0x16);
              deleteMembers_noInit(&local_d8,UA_TYPES + 0x16);
              local_d8.serverTimestamp = 0;
              local_d8.serverPicoseconds = 0;
              local_d8._90_6_ = 0;
              local_d8.sourceTimestamp = 0;
              local_d8.sourcePicoseconds = 0;
              local_d8._74_6_ = 0;
              local_d8.value.arrayDimensions = (UA_UInt32 *)0x0;
              local_d8.status = 0;
              local_d8._60_4_ = 0;
              local_d8.value.data = (void *)0x0;
              local_d8.value.arrayDimensionsSize = 0;
              local_d8.value.storageType = UA_VARIANT_DATA;
              local_d8.value._12_4_ = 0;
              local_d8.value.arrayLength = 0;
              local_d8._0_8_ = 0;
              local_d8.value.type = (UA_DataType *)0x0;
              lVar2 = *(long *)((long)pUVar1 + lVar9 + -0x18);
              if ((lVar2 == 0) ||
                 (((lVar2 == 0xe &&
                   (plVar3 = *(long **)((long)pUVar1 + lVar9 + -0x10),
                   session_00 = (UA_Session *)0x7972616e69422074,
                   *(long *)((long)plVar3 + 6) == 0x7972616e69422074 &&
                   *plVar3 == 0x20746c7561666544)) &&
                  (*(short *)((long)pUVar1 + lVar9 + -0x20) == 0)))) {
                if ((lVar2 == 0) || (*(int *)((long)pUVar1 + lVar9 + -0x38) == 0xd)) {
                  pUVar8 = (UA_Session *)UA_MonitoredItem_new();
                  if (pUVar8 == (UA_Session *)0x0) {
                    *(undefined4 *)((long)&local_38->statusCode + lVar10) = 0x80030000;
                  }
                  else {
                    local_40 = pUVar8;
                    UVar5 = UA_copy(local_70,(UA_NodeId *)
                                             &(pUVar8->clientDescription).applicationName.locale.
                                              data,UA_TYPES + 0x10);
                    if (UVar5 == 0) {
                      (local_40->clientDescription).productUri.length = (size_t)pUVar12;
                      (local_40->clientDescription).applicationType =
                           *(UA_ApplicationType *)((long)pUVar1 + lVar9 + -0x38);
                      UVar6 = pUVar12->lastMonitoredItemId + 1;
                      pUVar12->lastMonitoredItemId = UVar6;
                      *(UA_UInt32 *)&(local_40->clientDescription).productUri.data = UVar6;
                      *(UA_TimestampsToReturn *)
                       &(local_40->clientDescription).applicationName.locale.length = local_4c;
                      setMonitoredItemSettings
                                (local_48,(UA_MonitoredItem *)local_40,
                                 *(UA_MonitoringMode *)((long)pUVar1 + lVar9 + -8),
                                 (UA_MonitoringParameters *)
                                 ((long)&(pUVar1->itemToMonitor).nodeId.namespaceIndex + lVar9));
                      pUVar4 = (pUVar12->monitoredItems).lh_first;
                      (local_40->clientDescription).applicationUri.length = (size_t)pUVar4;
                      if (pUVar4 != (UA_MonitoredItem *)0x0) {
                        (pUVar4->listEntry).le_prev = (UA_MonitoredItem **)local_40;
                      }
                      local_58->lh_first = (UA_MonitoredItem *)local_40;
                      (local_40->clientDescription).applicationUri.data = (UA_Byte *)local_58;
                      if (*(int *)((long)pUVar1 + lVar9 + -8) == 2) {
                        UA_MoniteredItem_SampleCallback(local_48,(UA_MonitoredItem *)local_40);
                      }
                      pUVar8 = local_40;
                      session_00 = (UA_Session *)
                                   &(local_40->clientDescription).discoveryProfileUri.data;
                      UA_copy((void *)((long)pUVar1 + lVar9 + -0x30),session_00,UA_TYPES + 0xb);
                      *(size_t *)((long)&local_38->revisedSamplingInterval + lVar10) =
                           (pUVar8->clientDescription).gatewayServerUri.length;
                      *(undefined4 *)((long)&local_38->revisedQueueSize + lVar10) =
                           *(undefined4 *)
                            ((long)&(pUVar8->clientDescription).gatewayServerUri.data + 4);
                      *(undefined4 *)((long)&local_38->monitoredItemId + lVar10) =
                           *(undefined4 *)&(pUVar8->clientDescription).productUri.data;
                    }
                    else {
                      *(UA_StatusCode *)((long)&local_38->statusCode + lVar10) = UVar5;
                      session_00 = local_40;
                      MonitoredItem_delete(local_48,(UA_MonitoredItem *)local_40);
                    }
                  }
                }
                else {
                  *(undefined4 *)((long)&local_38->statusCode + lVar10) = 0x80380000;
                }
              }
              else {
                *(undefined4 *)((long)&local_38->statusCode + lVar10) = 0x80390000;
              }
            }
            else {
              *(UA_StatusCode *)((long)&local_38->statusCode + lVar10) = local_d8.status;
              session_00 = (UA_Session *)(UA_TYPES + 0x16);
              deleteMembers_noInit(&local_d8,UA_TYPES + 0x16);
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x48;
            lVar9 = lVar9 + 0x98;
          } while (uVar11 < local_60->itemsToCreateSize);
          return;
        }
        UVar5 = 0x80030000;
      }
    }
  }
LAB_001255bd:
  (response->responseHeader).serviceResult = UVar5;
  return;
}

Assistant:

void
Service_CreateMonitoredItems(UA_Server *server, UA_Session *session,
                             const UA_CreateMonitoredItemsRequest *request,
                             UA_CreateMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing CreateMonitoredItemsRequest");

    /* Check if the timestampstoreturn is valid */
    if(request->timestampsToReturn > UA_TIMESTAMPSTORETURN_NEITHER) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADTIMESTAMPSTORETURNINVALID;
        return;
    }

    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    if(request->itemsToCreateSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->itemsToCreateSize,
                                     &UA_TYPES[UA_TYPES_MONITOREDITEMCREATERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->itemsToCreateSize;

    for(size_t i = 0; i < request->itemsToCreateSize; ++i)
        Service_CreateMonitoredItems_single(server, session, sub, request->timestampsToReturn,
                                            &request->itemsToCreate[i], &response->results[i]);
}